

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O2

u16string *
anon_unknown.dwarf_ec6a::cpputf8_u32_to_u16(u16string *__return_storage_ptr__,u32string *u32)

{
  string u8;
  string local_30;
  
  cpputf8_u32_to_u8(&local_30,u32);
  cpputf8_u8_to_u16(__return_storage_ptr__,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

inline
u16string cpputf8_u32_to_u16(const u32string& u32)
{
    // As above, we need to do this in two steps
    const string u8 = cpputf8_u32_to_u8(u32);
    return cpputf8_u8_to_u16(u8);
}